

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser-standard.cc
# Opt level: O3

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,Model *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  undefined4 *puVar1;
  uint v;
  LookupParameters *pLVar2;
  Parameters *pPVar3;
  long lVar4;
  LSTMBuilder *this_00;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  value_type it;
  uint local_80 [2];
  undefined1 local_78 [8];
  undefined1 local_70 [20];
  ulong local_5c;
  LSTMBuilder *local_50;
  LSTMBuilder *local_48;
  LSTMBuilder *local_40;
  unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_38;
  
  local_38 = pretrained;
  cnn::LSTMBuilder::LSTMBuilder(&this->stack_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model);
  cnn::LSTMBuilder::LSTMBuilder(&this->action_lstm,LAYERS,ACTION_DIM,HIDDEN_DIM,model);
  local_40 = &this->action_lstm;
  cnn::LSTMBuilder::LSTMBuilder(&this->const_lstm_fwd,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model);
  local_48 = &this->const_lstm_fwd;
  cnn::LSTMBuilder::LSTMBuilder(&this->const_lstm_rev,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model);
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = INPUT_DIM;
  local_50 = &this->const_lstm_rev;
  pLVar2 = cnn::Model::add_lookup_parameters(model,VOCAB_SIZE,(Dim *)local_78);
  this->p_w = pLVar2;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = INPUT_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,VOCAB_SIZE,(Dim *)local_78);
  this->p_t = pLVar2;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,NT_SIZE,(Dim *)local_78);
  this->p_nt = pLVar2;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,NT_SIZE,(Dim *)local_78);
  this->p_ntup = pLVar2;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = ACTION_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,ACTION_SIZE,(Dim *)local_78);
  this->p_a = pLVar2;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = HIDDEN_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_pbias = pPVar3;
  local_80[0] = HIDDEN_DIM;
  local_80[1] = HIDDEN_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_A = pPVar3;
  local_80[0] = HIDDEN_DIM;
  local_80[1] = HIDDEN_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_B = pPVar3;
  local_80[0] = HIDDEN_DIM;
  local_80[1] = HIDDEN_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_S = pPVar3;
  local_80[0] = LSTM_INPUT_DIM;
  local_80[1] = INPUT_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_w2l = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_ib = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_cbias = pPVar3;
  local_80[0] = ACTION_SIZE;
  local_80[1] = HIDDEN_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_p2a = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = ACTION_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_action_start = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = ACTION_SIZE;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_abias = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_buffer_guard = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = LSTM_INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_stack_guard = pPVar3;
  local_80[0] = LSTM_INPUT_DIM;
  local_80[1] = LSTM_INPUT_DIM * 2;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_cW = pPVar3;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = POS_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,POS_SIZE,(Dim *)local_78);
  this->p_pos = pLVar2;
  local_80[0] = LSTM_INPUT_DIM;
  local_80[1] = POS_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_p2w = pPVar3;
  this_00 = (LSTMBuilder *)operator_new(200);
  cnn::LSTMBuilder::LSTMBuilder(this_00,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model);
  this->buffer_lstm = this_00;
  local_5c._0_4_ = 1;
  local_5c._4_4_ = 1;
  local_78._0_4_ = PRETRAINED_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,VOCAB_SIZE,(Dim *)local_78);
  this->p_t = pLVar2;
  p_Var6 = (local_38->_M_h)._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_78._0_4_ = *(undefined4 *)&p_Var6[1]._M_nxt;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_70,
                 (vector<float,_std::allocator<float>_> *)(p_Var6 + 2));
      cnn::LookupParameters::Initialize
                (this->p_t,local_78._0_4_,(vector<float,_std::allocator<float>_> *)local_70);
      if ((pointer)local_70._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  local_80[0] = LSTM_INPUT_DIM;
  local_80[1] = PRETRAINED_DIM;
  local_5c = 0x100000000;
  lVar4 = 0;
  do {
    uVar5 = local_5c & 0xffffffff;
    puVar1 = (undefined4 *)((long)local_80 + lVar4);
    lVar4 = lVar4 + 4;
    local_5c = CONCAT44(local_5c._4_4_,(uint)local_5c + 1);
    *(undefined4 *)(local_78 + uVar5 * 4) = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,(Dim *)local_78,0.0);
  this->p_t2l = pPVar3;
  return;
}

Assistant:

explicit ParserBuilder(Model* model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      const_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      const_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      p_w(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_t(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_nt(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_ntup(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_a(model->add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_pbias(model->add_parameters({HIDDEN_DIM})),
      p_A(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_w2l(model->add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model->add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model->add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model->add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model->add_parameters({ACTION_DIM})),
      p_abias(model->add_parameters({ACTION_SIZE})),

      p_buffer_guard(model->add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model->add_parameters({LSTM_INPUT_DIM})),

      p_cW(model->add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) {
      
      p_pos = model->add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2w = model->add_parameters({LSTM_INPUT_DIM, POS_DIM});
    
      buffer_lstm = new LSTMBuilder(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model);
      
      p_t = model->add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained) p_t->Initialize(it.first, it.second);
      p_t2l = model->add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
  }